

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O0

void __thiscall
JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::~GrowingArray
          (GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *this)

{
  Type pAVar1;
  Type pWVar2;
  uint32 uVar3;
  long *plVar4;
  long extraout_RDX;
  code *local_38;
  GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *this_local;
  
  if (this->buffer != (Type)0x0) {
    pAVar1 = this->alloc;
    local_38 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_int>::GetFreeFunc();
    plVar4 = (long *)((long)&(pAVar1->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_38 & 1) != 0) {
      local_38 = *(code **)(local_38 + *plVar4 + -1);
    }
    pWVar2 = this->buffer;
    uVar3 = UInt32Math::Mul(this->length,4);
    (*local_38)(plVar4,pWVar2,uVar3);
  }
  return;
}

Assistant:

~GrowingArray()
        {
            if (buffer != nullptr)
            {
                AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, UInt32Math::Mul(length, sizeof(TValue)));
            }
        }